

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger class_newmember(HSQUIRRELVM v)

{
  SQInteger SVar1;
  SQRESULT SVar2;
  SQBool bstatic_00;
  SQBool bstatic;
  
  SVar1 = sq_gettop(v);
  bstatic = 0;
  if (SVar1 == 5) {
    sq_tobool(v,-1,&bstatic);
    sq_pop(v,1);
    bstatic_00 = bstatic;
  }
  else {
    if (SVar1 < 4) {
      sq_pushnull(v);
    }
    bstatic_00 = 0;
  }
  SVar2 = sq_newmember(v,-4,bstatic_00);
  return SVar2 >> 0x3f | 1;
}

Assistant:

static SQInteger class_newmember(HSQUIRRELVM v)
{
    SQInteger top = sq_gettop(v);
    SQBool bstatic = SQFalse;
    if(top == 5)
    {
        sq_tobool(v,-1,&bstatic);
        sq_pop(v,1);
    }

    if(top < 4) {
        sq_pushnull(v);
    }
    return SQ_SUCCEEDED(sq_newmember(v,-4,bstatic))?1:SQ_ERROR;
}